

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Char * Diligent::GetCullModeLiteralName(CULL_MODE CullMode,bool GetEnumString)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000039;
  char (*in_R8) [2];
  string msg;
  int local_2c;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,CullMode) & 0xffffffff) {
  case 0:
    pcVar2 = "CULL_MODE_UNDEFINED";
    pcVar1 = "undefined";
    break;
  case 1:
    pcVar2 = "CULL_MODE_NONE";
    pcVar1 = "none";
    break;
  case 2:
    pcVar2 = "CULL_MODE_FRONT";
    pcVar1 = "front";
    break;
  case 3:
    pcVar2 = "CULL_MODE_BACK";
    pcVar1 = "back";
    break;
  default:
    local_2c = (int)(char)CullMode;
    FormatString<char[23],int,char[2]>
              (&local_28,(Diligent *)"Unexpected cull mode (",(char (*) [23])&local_2c,
               (int *)0x752f31,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetCullModeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "UNKNOWN";
  }
  if (GetEnumString) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const Char* GetCullModeLiteralName(CULL_MODE CullMode, bool GetEnumString)
{
    static_assert(CULL_MODE_NUM_MODES == 4, "Please update the switch below to handle the new cull mode");
    switch (CullMode)
    {
        // clang-format off
        case CULL_MODE_UNDEFINED: return GetEnumString ? "CULL_MODE_UNDEFINED" : "undefined";
        case CULL_MODE_NONE:      return GetEnumString ? "CULL_MODE_NONE"      : "none";
        case CULL_MODE_FRONT:     return GetEnumString ? "CULL_MODE_FRONT"     : "front";
        case CULL_MODE_BACK:      return GetEnumString ? "CULL_MODE_BACK"      : "back";
        // clang-format on
        default:
            UNEXPECTED("Unexpected cull mode (", static_cast<int>(CullMode), ")");
            return "UNKNOWN";
    }
}